

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O2

bool anon_unknown.dwarf_9d8bc::isIdContinuation(QChar c)

{
  uint uVar1;
  
  uVar1 = QChar::category((uint)(ushort)c.ucs);
  return (bool)((byte)(0xfc01b >> ((byte)uVar1 & 0x1f)) & uVar1 < 0x14);
}

Assistant:

static bool isIdContinuation(QChar c)
    {
        bool result = false;
        switch (c.category()) {
        case QChar::Letter_Uppercase:
        case QChar::Letter_Lowercase:
        case QChar::Letter_Titlecase:
        case QChar::Letter_Modifier:
        case QChar::Letter_Other:
        case QChar::Number_Letter:
        case QChar::Mark_NonSpacing:
        case QChar::Mark_SpacingCombining:
        case QChar::Number_DecimalDigit:
        case QChar::Punctuation_Connector: // '_'
            result = true;
            break;
        default:
            break;
        }
        return result;
    }